

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Packetizer.cpp
# Opt level: O1

size_t __thiscall axl::sl::PacketizerRoot::writeImpl(PacketizerRoot *this,void *p0,size_t size0)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  ulong count;
  ulong uVar4;
  size_t chunkSize;
  ulong uVar5;
  ulong count_00;
  ulong uVar6;
  bool bVar7;
  
  uVar4 = (this->m_buffer).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count;
  uVar6 = size0;
  while (uVar4 < 4) {
    bVar7 = uVar6 == 0;
    uVar6 = uVar6 - 1;
    if (bVar7) {
      return 0xffffffffffffffff;
    }
    cVar1 = *p0;
    if (cVar1 == *(char *)((long)&writeImpl::signatureBuffer + uVar4)) {
      sVar2 = (this->m_buffer).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count;
      bVar7 = Array<char,_axl::sl::ArrayDetails<char>_>::
              setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(&this->m_buffer,sVar2 + 1);
      pcVar3 = (this->m_buffer).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p;
      if (pcVar3 != (char *)0x0 && bVar7) {
        pcVar3[sVar2] = cVar1;
      }
      uVar4 = uVar4 + 1;
    }
    else if (uVar4 == 0) {
      uVar4 = 0;
    }
    else {
      Array<char,_axl::sl::ArrayDetails<char>_>::
      setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(&this->m_buffer,0);
      uVar4 = 0;
      if (cVar1 == '\x02') {
        uVar4 = 1;
        bVar7 = Array<char,_axl::sl::ArrayDetails<char>_>::
                setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(&this->m_buffer,1);
        if (bVar7) {
          *(this->m_buffer).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p = '\x02';
        }
      }
    }
    p0 = (void *)((long)p0 + 1);
  }
  count = uVar6;
  if (uVar4 < 8) {
    uVar4 = 8 - uVar4;
    count = uVar6 - uVar4;
    if (uVar6 < uVar4) {
      Array<char,_axl::sl::ArrayDetails<char>_>::insert
                (&this->m_buffer,0xffffffffffffffff,(char *)p0,uVar6);
      return 0xffffffffffffffff;
    }
    Array<char,_axl::sl::ArrayDetails<char>_>::insert
              (&this->m_buffer,0xffffffffffffffff,(char *)p0,uVar4);
    p0 = (void *)((long)p0 + uVar4);
    uVar4 = 8;
  }
  uVar5 = (ulong)(*(int *)((this->m_buffer).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p +
                          4) + 8);
  count_00 = uVar5 - uVar4;
  uVar6 = count;
  if (uVar4 <= uVar5 && count_00 != 0) {
    uVar6 = count - count_00;
    if (count < count_00) {
      Array<char,_axl::sl::ArrayDetails<char>_>::insert
                (&this->m_buffer,0xffffffffffffffff,(char *)p0,count);
      return 0xffffffffffffffff;
    }
    Array<char,_axl::sl::ArrayDetails<char>_>::insert
              (&this->m_buffer,0xffffffffffffffff,(char *)p0,count_00);
  }
  return size0 - uVar6;
}

Assistant:

size_t
PacketizerRoot::writeImpl(
	const void* p0,
	size_t size0
) {
	const char* p = (char*)p0;
	size_t size = size0;
	size_t bufferSize = m_buffer.getCount();

	static uint32_t signatureBuffer = PacketHdrSignature;
	const char* signature = (char*)&signatureBuffer;

	while (bufferSize < sizeof(uint32_t)) { // append signature byte-by-byte
		if (!size)
			return -1; // all is buffered

		char c = *p;

		if (c == signature[bufferSize]) {
			m_buffer.append(c);
			bufferSize++;
		} else if (bufferSize) {
			m_buffer.clear();
			bufferSize = 0;

			if (c == signature[0]) {
				m_buffer.copy(c);
				bufferSize = 1;
			}
		}

		p++;
		size--;
	}

	if (bufferSize < sizeof(uint64_t)) { // packet size
		size_t chunkSize = sizeof(uint64_t) - bufferSize;
		if (size < chunkSize) {
			m_buffer.append(p, size);
			return -1; // all is buffered
		}

		m_buffer.append(p, chunkSize);
		p += chunkSize;
		size -= chunkSize;

		bufferSize = sizeof(uint64_t);
	}

	uint32_t dataSize = ((const uint32_t*)m_buffer.cp()) [1];
	uint32_t packetSize = sizeof(uint64_t) + dataSize;

	if (bufferSize < packetSize) {
		size_t chunkSize = packetSize - bufferSize;
		if (size < chunkSize) {
			m_buffer.append(p, size);
			return -1; // all is buffered
		}

		m_buffer.append(p, chunkSize);
		p += chunkSize;
		size -= chunkSize;
	}

	ASSERT(size0 >= size);
	return size0 - size;
}